

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.c
# Opt level: O0

token * parse_enum_declaration(dmr_C *C,token *token,symbol *parent)

{
  int iVar1;
  undefined1 local_80 [8];
  Num v;
  symbol *sym;
  token *next;
  expression *expr;
  Num lower;
  Num upper;
  symbol *base_type;
  symbol *ctype;
  unsigned_long_long lastval;
  symbol *parent_local;
  token *token_local;
  dmr_C *C_local;
  
  ctype = (symbol *)0x0;
  base_type = (symbol *)0x0;
  upper.y = 0;
  lower.y = 0xffffffff;
  expr = (expression *)0x1;
  lower.x = 0;
  lower._4_4_ = 0;
  *(uint *)((long)&parent->field_14 + 0xc) =
       *(uint *)((long)&parent->field_14 + 0xc) & 0xffefffff | 0x100000;
  (parent->field_14).field_2.ctype.base_type = &C->S->int_ctype;
  parent_local = (symbol *)token;
  while (((uint)*(undefined8 *)parent_local & 0x3f) == 2) {
    next = (token *)0x0;
    sym = *(symbol **)&(parent_local->pos).field_0x4;
    iVar1 = dmrC_match_op((token *)sym,0x3d);
    if (iVar1 == 0) {
      if (base_type == (symbol *)0x0) {
        base_type = &C->S->int_ctype;
      }
      else {
        iVar1 = dmrC_is_int_type(C->S,base_type);
        if (iVar1 == 0) {
          dmrC_error_die(C,*(position *)parent_local,"can\'t increment the last enum member");
        }
        ctype = (symbol *)&ctype->field_0x1;
      }
    }
    else {
      sym = (symbol *)
            dmrC_conditional_expression(C,*(token **)&(sym->pos).field_0x4,(expression **)&next);
      ctype = (symbol *)dmrC_get_expression_value(C,(expression *)next);
      base_type = &C->S->void_ctype;
      if ((next != (token *)0x0) && ((next->field_2).number != (char *)0x0)) {
        base_type = (symbol *)(next->field_2).ident;
      }
    }
    if (next == (token *)0x0) {
      next = (token *)dmrC_alloc_expression(C,*(position *)parent_local,1);
      (((expression *)next)->field_5).field_4.symbol = ctype;
      ((expression *)next)->ctype = base_type;
    }
    v.y = (unsigned_long_long)dmrC_alloc_symbol(C->S,*(position *)parent_local,3);
    dmrC_bind_symbol(C->S,(symbol *)v.y,*(ident **)&(parent_local->endpos).field_0x4,NS_SYMBOL);
    *(ulong *)(v.y + 0x60) = *(ulong *)(v.y + 0x60) & 0xfffffffffff7ffff;
    *(token **)(v.y + 0xb0) = next;
    *(uint *)v.y = *(uint *)v.y & 0xffefffff | 0x100000;
    *(symbol **)(v.y + 0x80) = parent;
    dmrC_add_symbol(C,&(parent->field_14).field_2.symbol_list,(symbol *)v.y);
    if ((symbol *)upper.y != &C->S->bad_ctype) {
      if (((undefined1  [232])*base_type & (undefined1  [232])0xff) == (undefined1  [232])0x3) {
        base_type = (base_type->field_14).field_2.ctype.base_type;
      }
      if (((undefined1  [232])*base_type & (undefined1  [232])0xff) == (undefined1  [232])0x9) {
        if (base_type == parent) {
          base_type = (symbol *)upper.y;
        }
        else {
          base_type = (base_type->field_14).field_2.ctype.base_type;
        }
      }
      if (upper.y == 0) {
        upper.y = (unsigned_long_long)base_type;
      }
      else if (base_type != (symbol *)upper.y) {
        iVar1 = dmrC_is_int_type(C->S,(symbol *)upper.y);
        if ((iVar1 == 0) || (iVar1 = dmrC_is_int_type(C->S,base_type), iVar1 == 0)) {
          upper.y = (unsigned_long_long)&C->S->bad_ctype;
        }
        else {
          upper.y = (unsigned_long_long)bigger_enum_type(C,(symbol *)upper.y,base_type);
        }
      }
      (parent->field_14).field_2.ctype.base_type = (symbol *)upper.y;
    }
    iVar1 = dmrC_is_int_type(C->S,(symbol *)upper.y);
    if (iVar1 != 0) {
      v._0_8_ = ctype;
      if (((base_type->field_14).field_2.ctype.modifiers & 0x80) == 0) {
        if ((long)ctype < 0) {
          local_80._0_4_ = -1;
        }
        else {
          local_80._0_4_ = 0;
        }
      }
      else {
        local_80._0_4_ = 0;
      }
      upper_boundary((Num *)&lower.y,(Num *)local_80);
      lower_boundary((Num *)&expr,(Num *)local_80);
    }
    parent_local = sym;
    *(undefined8 *)(v.y + 0xc) = *(undefined8 *)sym;
    iVar1 = dmrC_match_op((token *)sym,0x2c);
    if (iVar1 == 0) break;
    parent_local = *(symbol **)&(sym->pos).field_0x4;
  }
  if (upper.y == 0) {
    dmrC_sparse_error(C,*(position *)parent_local,"bad enum definition");
    upper.y = (unsigned_long_long)&C->S->bad_ctype;
  }
  else {
    iVar1 = dmrC_is_int_type(C->S,(symbol *)upper.y);
    if ((iVar1 != 0) &&
       (iVar1 = type_is_ok(C,(symbol *)upper.y,(Num *)&lower.y,(Num *)&expr), iVar1 == 0)) {
      iVar1 = type_is_ok(C,&C->S->int_ctype,(Num *)&lower.y,(Num *)&expr);
      if (iVar1 == 0) {
        iVar1 = type_is_ok(C,&C->S->uint_ctype,(Num *)&lower.y,(Num *)&expr);
        if (iVar1 == 0) {
          iVar1 = type_is_ok(C,&C->S->long_ctype,(Num *)&lower.y,(Num *)&expr);
          if (iVar1 == 0) {
            iVar1 = type_is_ok(C,&C->S->ulong_ctype,(Num *)&lower.y,(Num *)&expr);
            if (iVar1 == 0) {
              iVar1 = type_is_ok(C,&C->S->llong_ctype,(Num *)&lower.y,(Num *)&expr);
              if (iVar1 == 0) {
                iVar1 = type_is_ok(C,&C->S->ullong_ctype,(Num *)&lower.y,(Num *)&expr);
                if (iVar1 == 0) {
                  upper.y = (unsigned_long_long)&C->S->bad_ctype;
                }
                else {
                  upper.y = (unsigned_long_long)&C->S->ullong_ctype;
                }
              }
              else {
                upper.y = (unsigned_long_long)&C->S->llong_ctype;
              }
            }
            else {
              upper.y = (unsigned_long_long)&C->S->ulong_ctype;
            }
          }
          else {
            upper.y = (unsigned_long_long)&C->S->long_ctype;
          }
        }
        else {
          upper.y = (unsigned_long_long)&C->S->uint_ctype;
        }
      }
      else {
        upper.y = (unsigned_long_long)&C->S->int_ctype;
      }
    }
  }
  (parent->field_14).field_2.ctype.base_type = (symbol *)upper.y;
  (parent->field_14).field_2.ctype.modifiers =
       *(ulong *)(upper.y + 0x60) & 0x80 | (parent->field_14).field_2.ctype.modifiers;
  *(uint *)((long)&parent->field_14 + 0xc) = *(uint *)((long)&parent->field_14 + 0xc) & 0xffefffff;
  cast_enum_list(C,(parent->field_14).field_2.symbol_list,(symbol *)upper.y);
  return (token *)parent_local;
}

Assistant:

static struct token *parse_enum_declaration(struct dmr_C *C, struct token *token, struct symbol *parent)
{
	unsigned long long lastval = 0;
	struct symbol *ctype = NULL, *base_type = NULL;
	Num upper = {-1, 0}, lower = {1, 0};

	parent->examined = 1;
	parent->ctype.base_type = &C->S->int_ctype;
	while (dmrC_token_type(token) == TOKEN_IDENT) {
		struct expression *expr = NULL;
		struct token *next = token->next;
		struct symbol *sym;

		if (dmrC_match_op(next, '=')) {
			next = dmrC_constant_expression(C, next->next, &expr);
			lastval = dmrC_get_expression_value(C, expr);
			ctype = &C->S->void_ctype;
			if (expr && expr->ctype)
				ctype = expr->ctype;
		} else if (!ctype) {
			ctype = &C->S->int_ctype;
		} else if (dmrC_is_int_type(C->S, ctype)) {
			lastval++;
		} else {
			dmrC_error_die(C, token->pos, "can't increment the last enum member");
		}

		if (!expr) {
			expr = dmrC_alloc_expression(C, token->pos, EXPR_VALUE);
			expr->value = lastval;
			expr->ctype = ctype;
		}

		sym = dmrC_alloc_symbol(C->S, token->pos, SYM_NODE);
		dmrC_bind_symbol(C->S, sym, token->ident, NS_SYMBOL);
		sym->ctype.modifiers &= ~MOD_ADDRESSABLE;
		sym->initializer = expr;
		sym->enum_member = 1;
		sym->ctype.base_type = parent;
		dmrC_add_symbol(C, &parent->symbol_list, sym);

		if (base_type != &C->S->bad_ctype) {
			if (ctype->type == SYM_NODE)
				ctype = ctype->ctype.base_type;
			if (ctype->type == SYM_ENUM) {
				if (ctype == parent)
					ctype = base_type;
				else 
					ctype = ctype->ctype.base_type;
			}
			/*
			 * base_type rules:
			 *  - if all enums are of the same type, then
			 *    the base_type is that type (two first
			 *    cases)
			 *  - if enums are of different types, they
			 *    all have to be integer types, and the
			 *    base type is at least "int_ctype".
			 *  - otherwise the base_type is "bad_ctype".
			 */
			if (!base_type) {
				base_type = ctype;
			} else if (ctype == base_type) {
				/* nothing */
			} else if (dmrC_is_int_type(C->S, base_type) && dmrC_is_int_type(C->S, ctype)) {
				base_type = bigger_enum_type(C, base_type, ctype);
			} else
				base_type = &C->S->bad_ctype;
			parent->ctype.base_type = base_type;
		}
		if (dmrC_is_int_type(C->S, base_type)) {
			Num v = {.y = lastval};
			if (ctype->ctype.modifiers & MOD_UNSIGNED)
				v.x = 0;
			else if ((long long)lastval >= 0)
				v.x = 0;
			else
				v.x = -1;
			upper_boundary(&upper, &v);
			lower_boundary(&lower, &v);
		}
		token = next;

		sym->endpos = token->pos;

		if (!dmrC_match_op(token, ','))
			break;
		token = token->next;
	}
	if (!base_type) {
		dmrC_sparse_error(C, token->pos, "bad enum definition");
		base_type = &C->S->bad_ctype;
	}
	else if (!dmrC_is_int_type(C->S, base_type))
                ; //base_type = base_type;
	else if (type_is_ok(C, base_type, &upper, &lower))
                ; //base_type = base_type;
	else if (type_is_ok(C, &C->S->int_ctype, &upper, &lower))
		base_type = &C->S->int_ctype;
	else if (type_is_ok(C, &C->S->uint_ctype, &upper, &lower))
		base_type = &C->S->uint_ctype;
	else if (type_is_ok(C, &C->S->long_ctype, &upper, &lower))
		base_type = &C->S->long_ctype;
	else if (type_is_ok(C, &C->S->ulong_ctype, &upper, &lower))
		base_type = &C->S->ulong_ctype;
	else if (type_is_ok(C, &C->S->llong_ctype, &upper, &lower))
		base_type = &C->S->llong_ctype;
	else if (type_is_ok(C, &C->S->ullong_ctype, &upper, &lower))
		base_type = &C->S->ullong_ctype;
	else
		base_type = &C->S->bad_ctype;
	parent->ctype.base_type = base_type;
	parent->ctype.modifiers |= (base_type->ctype.modifiers & MOD_UNSIGNED);
	parent->examined = 0;

	cast_enum_list(C, parent->symbol_list, base_type);

	return token;
}